

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O3

Vec_Int_t * Gia_ManOrigIdsRemapPairs(Vec_Int_t *vEquivPairs,int nObjs)

{
  int iVar1;
  Vec_Int_t *vMap;
  int *__s;
  Vec_Int_t *pVVar2;
  int *__s_00;
  ulong uVar3;
  long lVar4;
  
  vMap = (Vec_Int_t *)malloc(0x10);
  iVar1 = 0x10;
  if (0xe < nObjs - 1U) {
    iVar1 = nObjs;
  }
  vMap->nCap = iVar1;
  if (iVar1 == 0) {
    vMap->pArray = (int *)0x0;
    vMap->nSize = nObjs;
LAB_001fc7c1:
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar1 * 4);
    vMap->pArray = __s;
    vMap->nSize = nObjs;
    if (__s == (int *)0x0) goto LAB_001fc7c1;
    memset(__s,0xff,(long)nObjs << 2);
  }
  if (1 < vEquivPairs->nSize) {
    lVar4 = 1;
    do {
      Gia_ManOrigIdsRemapPairsInsert
                (vMap,vEquivPairs->pArray[lVar4 + -1],vEquivPairs->pArray[lVar4]);
      lVar4 = lVar4 + 2;
    } while ((int)lVar4 < vEquivPairs->nSize);
  }
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  pVVar2->nCap = iVar1;
  if (iVar1 == 0) {
    pVVar2->pArray = (int *)0x0;
    pVVar2->nSize = nObjs;
LAB_001fc849:
    __s_00 = (int *)0x0;
  }
  else {
    __s_00 = (int *)malloc((long)iVar1 << 2);
    pVVar2->pArray = __s_00;
    pVVar2->nSize = nObjs;
    if (__s_00 == (int *)0x0) goto LAB_001fc849;
    memset(__s_00,0xff,(long)nObjs << 2);
  }
  if (nObjs < 1) {
    if (__s == (int *)0x0) goto LAB_001fc887;
  }
  else {
    uVar3 = 0;
    do {
      if (-1 < __s[uVar3]) {
        iVar1 = Gia_ManOrigIdsRemapPairsExtract(vMap,__s[uVar3]);
        if ((uint)nObjs <= uVar3) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        __s_00[uVar3] = iVar1;
      }
      uVar3 = uVar3 + 1;
    } while ((uint)nObjs != uVar3);
  }
  free(__s);
LAB_001fc887:
  free(vMap);
  return pVVar2;
}

Assistant:

Vec_Int_t * Gia_ManOrigIdsRemapPairs( Vec_Int_t * vEquivPairs, int nObjs )
{
    Vec_Int_t * vMapResult;
    Vec_Int_t * vMap2Smaller;
    int i, One, Two;
    // map bigger into smaller one
    vMap2Smaller = Vec_IntStartFull( nObjs );
    Vec_IntForEachEntryDouble( vEquivPairs, One, Two, i )
        Gia_ManOrigIdsRemapPairsInsert( vMap2Smaller, One, Two );
    // collect results in the topo order
    vMapResult = Vec_IntStartFull( nObjs );
    Vec_IntForEachEntry( vMap2Smaller, One, i )
        if ( One >= 0 )
            Vec_IntWriteEntry( vMapResult, i, Gia_ManOrigIdsRemapPairsExtract(vMap2Smaller, One) );
    Vec_IntFree( vMap2Smaller );
    return vMapResult;
}